

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  ImGuiInputEvent *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiKeyData *pIVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  ImGuiInputEvent e;
  undefined1 local_38 [20];
  undefined4 local_24;
  
  pIVar2 = GImGui;
  if (key != 0) {
    this->BackendUsingLegacyKeyArrays = '\0';
    if (key - 0x269U < 0x18) {
      this->BackendUsingLegacyNavInputArray = false;
    }
    pIVar3 = ImGui::GetKeyData(key);
    if (pIVar3->Down == down) {
      if ((pIVar3->AnalogValue == analog_value) && (!NAN(pIVar3->AnalogValue) && !NAN(analog_value))
         ) {
        uVar4 = (ulong)(uint)(pIVar2->InputEventsQueue).Size;
        lVar5 = uVar4 * 0x18 + -0x10;
        bVar6 = false;
        while ((0 < (int)uVar4 && (!bVar6))) {
          pIVar1 = (pIVar2->InputEventsQueue).Data;
          if (*(int *)((long)pIVar1 + lVar5 + -8) == 4) {
            bVar6 = *(int *)((long)&pIVar1->Type + lVar5) == key;
          }
          else {
            bVar6 = false;
          }
          uVar4 = (ulong)((int)uVar4 - 1);
          lVar5 = lVar5 + -0x18;
        }
        if (!bVar6) {
          return;
        }
      }
    }
    local_24._0_1_ = false;
    local_24._1_3_ = 0;
    local_38._0_4_ = ImGuiInputEventType_Key;
    local_38._4_4_ = (key - 0x269U < 0x18) + ImGuiInputSource_Keyboard;
    local_38._13_3_ = 0;
    local_38[0xc] = down;
    local_38._16_4_ = analog_value;
    local_38._8_4_ = key;
    ImVector<ImGuiInputEvent>::push_back(&pIVar2->InputEventsQueue,(ImGuiInputEvent *)local_38);
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}